

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::invalidateBackingStore<QRegion>(QWidgetPrivate *this,QRegion *r)

{
  bool bVar1;
  ulong uVar2;
  QWidget *this_00;
  QTLWExtra *pQVar3;
  pointer pQVar4;
  QRegion *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  QTLWExtra *tlwExtra;
  QWidget *q;
  QRegion masked;
  QRegion clipped;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QRegion local_28;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  QRegion r_00;
  QWidgetRepaintManager *this_01;
  
  this_01 = *(QWidgetRepaintManager **)(in_FS_OFFSET + 0x28);
  uVar2 = QRegion::isEmpty();
  if (((uVar2 & 1) == 0) && (uVar2 = QCoreApplication::closingDown(), (uVar2 & 1) == 0)) {
    this_00 = q_func(in_RDI);
    bVar1 = QWidget::isVisible((QWidget *)0x3ac776);
    if ((bVar1) && (bVar1 = QWidget::updatesEnabled((QWidget *)0x3ac786), bVar1)) {
      QWidget::window(this_00);
      QWidget::d_func((QWidget *)0x3ac7a1);
      pQVar3 = maybeTopData((QWidgetPrivate *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (((pQVar3 != (QTLWExtra *)0x0) && (pQVar3->backingStore != (QBackingStore *)0x0)) &&
         (bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                              *)0x3ac7d0), bVar1)) {
        r_00.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion((QRegion *)&stack0xfffffffffffffff0,in_RSI);
        QVar5 = clipRect(in_stack_ffffffffffffffe0);
        QRegion::operator&=((QRegion *)&stack0xfffffffffffffff0,(QRect *)&stack0xffffffffffffffe0);
        uVar2 = QRegion::isEmpty();
        if ((uVar2 & 1) == 0) {
          if (((in_RDI->graphicsEffect == (QGraphicsEffect *)0x0) &&
              (bVar1 = std::unique_ptr::operator_cast_to_bool
                                 ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3ac852),
              bVar1)) &&
             (pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                                 ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3ac868),
             (*(ushort *)&pQVar4->field_0x7c >> 7 & 1) != 0)) {
            local_28.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                               ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3ac899);
            QRegion::QRegion(&local_28,(QRegion *)&pQVar4->mask);
            QRegion::operator&=(&local_28,(QRegion *)&stack0xfffffffffffffff0);
            uVar2 = QRegion::isEmpty();
            if ((uVar2 & 1) == 0) {
              std::unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::
              operator->((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                          *)0x3ac8e1);
              QWidgetRepaintManager::markDirty<QRegion>
                        (this_01,(QRegion *)r_00.d,QVar5._8_8_,QVar5.y1.m_i.m_i,QVar5.x1.m_i.m_i);
            }
            QRegion::~QRegion(&local_28);
          }
          else {
            std::unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::
            operator->((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                        *)0x3ac928);
            QWidgetRepaintManager::markDirty<QRegion>
                      (this_01,(QRegion *)r_00.d,QVar5._8_8_,QVar5.y1.m_i.m_i,QVar5.x1.m_i.m_i);
          }
        }
        QRegion::~QRegion((QRegion *)&stack0xfffffffffffffff0);
      }
    }
  }
  if (*(QWidgetRepaintManager **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::invalidateBackingStore(const T &r)
{
    if (r.isEmpty())
        return;

    if (QCoreApplication::closingDown())
        return;

    Q_Q(QWidget);
    if (!q->isVisible() || !q->updatesEnabled())
        return;

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (!tlwExtra || !tlwExtra->backingStore || !tlwExtra->repaintManager)
        return;

    T clipped(r);
    clipped &= clipRect();
    if (clipped.isEmpty())
        return;

    if (!graphicsEffect && extra && extra->hasMask) {
        QRegion masked(extra->mask);
        masked &= clipped;
        if (masked.isEmpty())
            return;

        tlwExtra->repaintManager->markDirty(masked, q,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    } else {
        tlwExtra->repaintManager->markDirty(clipped, q,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    }
}